

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O1

Var create_const_vector(Context *ctx,ConstVector *consts)

{
  long lVar1;
  undefined8 uVar2;
  Var pvVar3;
  Var obj;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char local_68 [8];
  char buf [32];
  
  pvVar3 = (*ctx->chakra->spec->createArray)(ctx->chakra->user_data);
  if ((consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar7 = 0x28;
    uVar6 = 0;
    buf._24_8_ = consts;
    do {
      uVar2 = buf._24_8_;
      obj = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
      (*ctx->chakra->spec->push)(pvVar3,obj,ctx->chakra->user_data);
      lVar1 = *(long *)uVar2;
      uVar5 = (*(long *)(uVar2 + 8) - lVar1 >> 3) * 0x6db6db6db6db6db7;
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      switch(*(undefined4 *)(lVar1 + -8 + lVar7)) {
      case 0xfffffffc:
        pcVar4 = "f64";
        break;
      case 0xfffffffd:
        pcVar4 = "f32";
        goto LAB_00f3b46b;
      case 0xfffffffe:
        pcVar4 = "i64";
        break;
      case 0xffffffff:
        pcVar4 = "i32";
LAB_00f3b46b:
        write_string(ctx,obj,0xb,pcVar4,0xffffffff);
        snprintf(local_68,0x20,"%u",(ulong)*(uint *)(lVar1 + lVar7));
        goto LAB_00f3b48e;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                      ,200,"Js::Var create_const_vector(Context *, const ConstVector &)");
      }
      write_string(ctx,obj,0xb,pcVar4,0xffffffff);
      snprintf(local_68,0x20,"%llu",*(undefined8 *)(lVar1 + lVar7));
LAB_00f3b48e:
      write_string(ctx,obj,0xc,local_68,0xffffffff);
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x38;
    } while (uVar6 < (ulong)((*(long *)(buf._24_8_ + 8) - *(long *)buf._24_8_ >> 3) *
                            0x6db6db6db6db6db7));
  }
  return pvVar3;
}

Assistant:

Js::Var create_const_vector(Context* ctx, const ConstVector& consts)
{
    Js::Var constsArr = ctx->chakra->spec->createArray(ctx->chakra->user_data);

    size_t i;
    for (i = 0; i < consts.size(); ++i)
    {
        Js::Var constDescriptor = ctx->chakra->spec->createObject(ctx->chakra->user_data);
        ctx->chakra->spec->push(constsArr, constDescriptor, ctx->chakra->user_data);

        char buf[32];
        const Const& const_ = consts.at(i);
        switch (const_.type)
        {
        case Type::I32:
            write_string(ctx, constDescriptor, PropertyIds::type, "i32");
            wabt_snprintf(buf, 32, "%u", const_.u32);
            break;
        case Type::I64:
            write_string(ctx, constDescriptor, PropertyIds::type, "i64");
            wabt_snprintf(buf, 32, "%llu", const_.u64);
            break;
        case Type::F32:
            write_string(ctx, constDescriptor, PropertyIds::type, "f32");
            wabt_snprintf(buf, 32, "%u", const_.f32_bits);
            break;
        case Type::F64:
            write_string(ctx, constDescriptor, PropertyIds::type, "f64");
            wabt_snprintf(buf, 32, "%llu", const_.f64_bits);
            break;
        default:
            assert(0);
            throw WabtAPIError("invalid constant type");
        }
        write_string(ctx, constDescriptor, PropertyIds::value, buf);
    }
    return constsArr;
}